

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputPFBDecodeStream.cpp
# Opt level: O0

void __thiscall InputPFBDecodeStream::SkipTillToken(InputPFBDecodeStream *this)

{
  bool bVar1;
  uint uVar2;
  EStatusCode EVar3;
  Byte local_11;
  InputPFBDecodeStream *pIStack_10;
  Byte buffer;
  InputPFBDecodeStream *this_local;
  
  local_11 = '\0';
  if ((this->mInternalState == eSuccess) &&
     (pIStack_10 = this, uVar2 = (*(this->super_IByteReader)._vptr_IByteReader[3])(),
     (uVar2 & 1) != 0)) {
    do {
      bVar1 = IsSegmentNotEnded(this);
      if (!bVar1) {
        return;
      }
      EVar3 = GetNextByteForToken(this,&local_11);
      if (EVar3 != eSuccess) {
        return;
      }
      bVar1 = IsPostScriptWhiteSpace(this,local_11);
    } while (bVar1);
    SaveTokenBuffer(this,local_11);
  }
  return;
}

Assistant:

void InputPFBDecodeStream::SkipTillToken()
{
	Byte buffer = 0;

	if(mInternalState != PDFHummus::eSuccess || !NotEnded())
		return;

	// skip till hitting first non space, or segment end
	while(IsSegmentNotEnded())
	{
		if(GetNextByteForToken(buffer) != PDFHummus::eSuccess)
			break;

		if(!IsPostScriptWhiteSpace(buffer))
		{
			SaveTokenBuffer(buffer);
			break;
		}
	}
}